

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void cmServer::reportProgress(char *msg,float progress,void *data)

{
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  void *local_28;
  cmServerRequest *request;
  void *data_local;
  char *pcStack_10;
  float progress_local;
  char *msg_local;
  
  local_28 = data;
  request = (cmServerRequest *)data;
  data_local._4_4_ = progress;
  pcStack_10 = msg;
  if (data != (void *)0x0) {
    if ((progress < 0.0) || (1.0 < progress)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_48,msg,&local_49);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"",&local_81);
      cmServerRequest::ReportMessage((cmServerRequest *)data,&local_48,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a8,msg,&local_a9);
      cmServerRequest::ReportProgress
                ((cmServerRequest *)data,0,(int)(progress * 1000.0),1000,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    return;
  }
  __assert_fail("request",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                ,0x98,"static void cmServer::reportProgress(const char *, float, void *)");
}

Assistant:

void cmServer::reportProgress(const char* msg, float progress, void* data)
{
  const cmServerRequest* request = static_cast<const cmServerRequest*>(data);
  assert(request);
  if (progress < 0.0f || progress > 1.0f) {
    request->ReportMessage(msg, "");
  } else {
    request->ReportProgress(0, static_cast<int>(progress * 1000), 1000, msg);
  }
}